

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# obj-init.c
# Opt level: O2

parser_error parse_object_base_defaults(parser *p)

{
  wchar_t wVar1;
  int iVar2;
  void *pvVar3;
  char *__s1;
  
  pvVar3 = parser_priv(p);
  if (pvVar3 == (void *)0x0) {
    __assert_fail("d",
                  "/workspace/llm4binary/github/license_c_cmakelists/angband[P]angband/src/obj-init.c"
                  ,0x1ed,"enum parser_error parse_object_base_defaults(struct parser *)");
  }
  __s1 = parser_getsym(p,"label");
  wVar1 = parser_getint(p,"value");
  iVar2 = strcmp(__s1,"break-chance");
  if (iVar2 == 0) {
    *(wchar_t *)((long)pvVar3 + 0x88) = wVar1;
  }
  else {
    iVar2 = strcmp(__s1,"max-stack");
    if (iVar2 != 0) {
      return PARSE_ERROR_UNDEFINED_DIRECTIVE;
    }
    *(wchar_t *)((long)pvVar3 + 0x8c) = wVar1;
  }
  return PARSE_ERROR_NONE;
}

Assistant:

static enum parser_error parse_object_base_defaults(struct parser *p) {
	const char *label;
	int value;
	struct kb_parsedata *d = parser_priv(p);

	assert(d);
	label = parser_getsym(p, "label");
	value = parser_getint(p, "value");
	if (streq(label, "break-chance")) {
		d->defaults.break_perc = value;
	} else if (streq(label, "max-stack")) {
		d->defaults.max_stack = value;
	} else {
		return PARSE_ERROR_UNDEFINED_DIRECTIVE;
	}
	return PARSE_ERROR_NONE;
}